

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

void __thiscall NaPetriNet::initialize(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  char cVar2;
  int iVar3;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  undefined4 extraout_var_02;
  char *pcVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 *puVar7;
  byte bVar8;
  uint uVar9;
  bool bVar10;
  bool bStarter;
  undefined8 uStack_38;
  
  if (0 < (this->pnaNet).nItems) {
    bVar8 = bDoPrintouts | this->bInitPrintout;
    pNVar1 = &this->pnaNet;
    uVar9 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
      if (*(long *)CONCAT44(extraout_var,iVar3) == 0) {
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0;
        __cxa_throw(puVar7,&NaException::typeinfo,0);
      }
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
      pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_00,iVar3));
      if (*pcVar4 == '\0') {
        bVar10 = false;
      }
      else {
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_01,iVar3));
        sVar5 = strlen(pcVar4);
        pcVar4 = (char *)operator_new__(sVar5 + 9);
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        pcVar6 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar3));
        strcpy(pcVar4,pcVar6);
        sVar5 = strlen(pcVar4);
        builtin_strncpy(pcVar4 + sVar5,"_verbose",9);
        pcVar6 = getenv(pcVar4);
        if (pcVar6 == (char *)0x0) {
          bVar10 = false;
        }
        else {
          bVar10 = *pcVar6 != '\0';
        }
        operator_delete__(pcVar4);
      }
      if (bVar8 != 0) {
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_03,iVar3));
        NaPrintLog("node \'%s\'\n",pcVar4);
      }
      if (bVar10) {
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        (**(code **)(**(long **)CONCAT44(extraout_var_04,iVar3) + 0x20))
                  (*(long **)CONCAT44(extraout_var_04,iVar3),1);
      }
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
      cVar2 = (**(code **)(**(long **)CONCAT44(extraout_var_05,iVar3) + 0x18))();
      if (cVar2 != '\0') {
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_06,iVar3));
        NaPrintLog("node \'%s\' is VERBOSE\n",pcVar4);
      }
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
      (**(code **)(**(long **)CONCAT44(extraout_var_07,iVar3) + 0x80))
                (*(long **)CONCAT44(extraout_var_07,iVar3),(long)&uStack_38 + 7);
      if ((uStack_38._7_1_ & bVar8) == 1) {
        iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar9);
        pcVar4 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_08,iVar3));
        NaPrintLog("node \'%s\' is starter.\n",pcVar4);
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (this->pnaNet).nItems);
  }
  return;
}

Assistant:

void
NaPetriNet::initialize (bool bDoPrintouts)
{
    int     iNode;

    if(bInitPrintout)
      bDoPrintouts = bInitPrintout;

    // 6. Initialize node activity and setup starter flag if needed
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            bool    bStarter = false;
	    bool    bVerbose = false;

	    if(NULL == pnaNet[iNode])
	      throw(na_null_pointer);

	    // Check for verbosity set in env. variable
	    if(strlen(pnaNet[iNode]->name()) > 0){
	      char	*szNodeVerbose = new char[strlen(pnaNet[iNode]->name())
						 + sizeof("_verbose")];
	      strcat(strcpy(szNodeVerbose, pnaNet[iNode]->name()), "_verbose");
	      if(NULL != getenv(szNodeVerbose))
		if(strlen(getenv(szNodeVerbose)) > 0)
		  bVerbose = true;
	      delete[] szNodeVerbose;
	    }

            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }

	    // Don't touch verbosity in case of direct setting from
	    // the program...
	    if(bVerbose)
	      pnaNet[iNode]->verbose(bVerbose);

	    // ...but inform an user in log file anyway
	    if(pnaNet[iNode]->is_verbose())
	      NaPrintLog("node '%s' is VERBOSE\n", pnaNet[iNode]->name());

            pnaNet[iNode]->initialize(bStarter);

            if(bStarter){
                if(bDoPrintouts){
                    NaPrintLog("node '%s' is starter.\n",
                               pnaNet[iNode]->name());
                }

                // Each starter node must commit output data at initialize
                // phase of execution due to semantics may be complicated
                // enough and be obscured from net.
                //OLD If the node is starter then it produced output data
                //OLD on the initialize phase already
                //OLD pnaNet[iNode]->commit_data(pckOutput);
            }
        }catch(NaException exCode){
            NaPrintLog("Initialization phase (#6): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }
}